

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

int fft2dInit(long M2,long M)

{
  float *pfVar1;
  ulong in_RDI;
  int theError;
  long unaff_retaddr;
  int local_14;
  
  local_14 = 1;
  if ((-1 < (long)in_RDI) && (in_RDI < 0x40)) {
    local_14 = 0;
    if (Array2d[in_RDI] == (float *)0x0) {
      pfVar1 = (float *)malloc((1L << ((byte)in_RDI & 0x3f)) << 5);
      Array2d[in_RDI] = pfVar1;
      if (Array2d[in_RDI] == (float *)0x0) {
        local_14 = 2;
      }
      else {
        local_14 = fftInit(unaff_retaddr);
      }
    }
    if (local_14 == 0) {
      local_14 = fftInit(unaff_retaddr);
    }
  }
  return local_14;
}

Assistant:

int fft2dInit(long M2, long M){
	// init for fft2d, ifft2d, rfft2d, and rifft2d
	// malloc storage for 4 columns of 2d ffts then call fftinit for both row and column ffts sizes
/* INPUTS */
/* M = log2 of number of columns */
/* M2 = log2 of number of rows */
/*       of 2d matrix to be fourier transformed */
/* OUTPUTS */
/* private storage for columns of 2d ffts	*/
/* calls fftInit for cosine and bit reversed tables	*/
int theError = 1;
if ((M2 >= 0) && (M2 < 8*sizeof(long))){
	theError = 0;
	if (Array2d[M2] == 0){
		Array2d[M2] = (float *) malloc( 4*2*POW2(M2)*sizeof(float) );
		if (Array2d[M2] == 0)
			theError = 2;
		else{
			theError = fftInit(M2);
		}
	}
	if (theError == 0)
		theError = fftInit(M);
}
return theError;
}